

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductMenu.h
# Opt level: O0

void __thiscall
ProductMenu::ProductMenu
          (ProductMenu *this,string *title,string *subs,int size,
          vector<Product_*,_std::allocator<Product_*>_> *pList)

{
  string local_50;
  vector<Product_*,_std::allocator<Product_*>_> *local_30;
  vector<Product_*,_std::allocator<Product_*>_> *pList_local;
  string *psStack_20;
  int size_local;
  string *subs_local;
  string *title_local;
  ProductMenu *this_local;
  
  local_30 = pList;
  pList_local._4_4_ = size;
  psStack_20 = subs;
  subs_local = title;
  title_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)title);
  Menu::Menu(&this->super_Menu,&local_50,psStack_20,pList_local._4_4_);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Menu)._vptr_Menu = (_func_int **)&PTR_menuSwitch_0011ad50;
  std::vector<Product_*,_std::allocator<Product_*>_>::vector(&this->productList);
  this->proList = local_30;
  std::vector<Product_*,_std::allocator<Product_*>_>::operator=(&this->productList,this->proList);
  return;
}

Assistant:

ProductMenu(string title, string* subs, int size, vector<Product*> *pList) : Menu(title, subs, size){
        proList = pList;
        productList = *proList;
    }